

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStyledRepresentation::~IfcStyledRepresentation
          (IfcStyledRepresentation *this)

{
  void *pvVar1;
  pointer pLVar2;
  pointer pcVar3;
  
  *(undefined8 *)&this[-1].super_IfcStyleModel.super_IfcRepresentation.field_0x28 = 0x849698;
  *(undefined8 *)
   &(this->super_IfcStyleModel).super_IfcRepresentation.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.field_0x10 = 0x8496c0;
  pvVar1 = *(void **)&this[-1].super_IfcStyleModel.super_IfcRepresentation.field_0x90;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  pLVar2 = this[-1].super_IfcStyleModel.super_IfcRepresentation.Items.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar2 != (pointer)((long)&this[-1].super_IfcStyleModel.super_IfcRepresentation.Items.
                                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                                 .
                                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                                 ._M_impl.super__Vector_impl_data + 0x10U)) {
    operator_delete(pLVar2);
  }
  pcVar3 = this[-1].super_IfcStyleModel.super_IfcRepresentation.RepresentationType.ptr._M_dataplus.
           _M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 !=
      &this[-1].super_IfcStyleModel.super_IfcRepresentation.RepresentationType.ptr.field_2) {
    operator_delete(pcVar3);
  }
  operator_delete(&this[-1].super_IfcStyleModel.super_IfcRepresentation.field_0x28);
  return;
}

Assistant:

IfcStyledRepresentation() : Object("IfcStyledRepresentation") {}